

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<VCProjectSingleConfig>::detachAndGrow
          (QArrayDataPointer<VCProjectSingleConfig> *this,GrowthPosition where,qsizetype n,
          VCProjectSingleConfig **data,QArrayDataPointer<VCProjectSingleConfig> *old)

{
  Data *pDVar1;
  bool bVar2;
  long lVar3;
  
  pDVar1 = this->d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
  goto LAB_0020a4ff;
  if (n == 0) {
    return;
  }
  if (where == GrowsAtEnd) {
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = ((pDVar1->super_QArrayData).alloc - this->size) +
              ((long)((long)this->ptr -
                     ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
              >> 4) * 0x47ec28c89c855f9f;
    }
joined_r0x0020a596:
    if (n <= lVar3) {
      return;
    }
  }
  else if (where == GrowsAtBeginning) {
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = ((long)((long)this->ptr -
                     ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
              >> 4) * -0x47ec28c89c855f9f;
    }
    goto joined_r0x0020a596;
  }
  bVar2 = tryReadjustFreeSpace(this,where,n,data);
  if (bVar2) {
    return;
  }
LAB_0020a4ff:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }